

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_PoolAllocator.h
# Opt level: O3

ConcreteType * __thiscall
soul::PoolAllocator::allocate<soul::AST::ConcreteType,soul::AST::Context&,soul::Type&>
          (PoolAllocator *this,Context *args,Type *args_1)

{
  size_t sVar1;
  DestructorFn *pDVar2;
  Structure *pSVar3;
  SourceCodeText *pSVar4;
  Scope *pSVar5;
  PoolItem *pPVar6;
  
  pPVar6 = allocateSpaceForObject(this,0x48);
  sVar1 = *(size_t *)args_1;
  pDVar2 = *(DestructorFn **)&args_1->boundingSize;
  pSVar3 = (args_1->structure).object;
  if (pSVar3 != (Structure *)0x0) {
    (pSVar3->super_RefCountedObject).refCount = (pSVar3->super_RefCountedObject).refCount + 1;
  }
  *(undefined4 *)&pPVar6->field_0x18 = 0x11;
  pSVar4 = (args->location).sourceCode.object;
  pPVar6[1].size = (size_t)pSVar4;
  if (pSVar4 != (SourceCodeText *)0x0) {
    (pSVar4->super_RefCountedObject).refCount = (pSVar4->super_RefCountedObject).refCount + 1;
  }
  pSVar5 = args->parentScope;
  pPVar6[1].destructor = (DestructorFn *)(args->location).location.data;
  pPVar6[1].item = pSVar5;
  *(undefined4 *)&pPVar6[1].field_0x18 = 1;
  pPVar6->item = &PTR__ConcreteType_002cb538;
  pPVar6[2].size = sVar1;
  pPVar6[2].destructor = pDVar2;
  pPVar6[2].item = pSVar3;
  RefCountedPtr<soul::Structure>::decIfNotNull((Structure *)0x0);
  pPVar6->destructor =
       allocate<soul::AST::ConcreteType,_soul::AST::Context_&,_soul::Type_&>::
       anon_class_1_0_00000001::__invoke;
  return (ConcreteType *)&pPVar6->item;
}

Assistant:

Type& allocate (Args&&... args)
    {
        static_assert (sizeof (Type) + itemHeaderSize <= sizeof (Pool::space), "Can't allocate a pool object bigger than the pool block size");
        auto& newItem = allocateSpaceForObject (sizeof (Type));
        auto newObject = new (std::addressof (newItem.item)) Type (std::forward<Args> (args)...);

        // NB: the constructor may throw, so we have to be careful not to register its destructor until afterwards
        if constexpr (! std::is_trivially_destructible<Type>::value)
            newItem.destructor = [] (void* t) { static_cast<Type*> (t)->~Type(); };

        return *newObject;
    }